

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_chunked_sequence.cpp
# Opt level: O0

void __thiscall
ChunkedSequenceResize_ThreeElementsDownToZero_Test::TestBody
          (ChunkedSequenceResize_ThreeElementsDownToZero_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_1a8;
  AssertHelper local_188;
  Message local_180;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_;
  Message local_158;
  uint local_14c;
  size_t local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_4;
  Message local_128;
  uint local_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [24];
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_3;
  Message local_d8;
  uint local_cc;
  size_type local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  Message local_a8;
  uint local_9c;
  size_t local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Message local_78;
  uint local_6c;
  size_t local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  int local_48;
  int local_34;
  undefined1 local_30 [8];
  cseq_int cs;
  ChunkedSequenceResize_ThreeElementsDownToZero_Test *this_local;
  
  cs.size_ = (size_type)this;
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunked_sequence
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30);
  local_34 = 0x25;
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::emplace_back<int>
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30,&local_34);
  local_48 = 0x29;
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::emplace_back<int>
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30,&stack0xffffffffffffffb8);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x2b;
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::emplace_back<int>
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30,
             (int *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4));
  local_68 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunks_size
                       ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30);
  local_6c = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_60,"cs.chunks_size ()","2U",&local_68,&local_6c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x16c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::resize
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30,0);
  local_98 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunks_size
                       ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30);
  local_9c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_90,"cs.chunks_size ()","1U",&local_98,&local_9c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x16f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_c8 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::size
                       ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30);
  local_cc = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_c0,"cs.size ()","0U",&local_c8,&local_cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x170,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  std::begin<pstore::chunked_sequence<int,2ul,4ul,4ul>>
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_108);
  std::end<pstore::chunked_sequence<int,2ul,4ul,4ul>>
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_118);
  local_108._16_8_ =
       std::distance<pstore::chunked_sequence<int,2ul,4ul,4ul>::iterator_base<false>>
                 ((iterator_base<false> *)local_108,(iterator_base<false> *)local_118);
  local_11c = 0;
  testing::internal::EqHelper::Compare<long,_unsigned_int,_nullptr>
            ((EqHelper *)local_f0,"std::distance (std::begin (cs), std::end (cs))","0U",
             (long *)(local_108 + 0x10),&local_11c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x171,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_148 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::capacity
                        ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30);
  local_14c = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_140,"cs.capacity ()","2U",&local_148,&local_14c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x172,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  local_171 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::empty
                        ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_170,&local_171,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a8,(internal *)local_170,(AssertionResult *)"cs.empty ()","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x173,pcVar2);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::~chunked_sequence
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30);
  return;
}

Assistant:

TEST (ChunkedSequenceResize, ThreeElementsDownToZero) {
    cseq_int cs;
    cs.emplace_back (37);
    cs.emplace_back (41);
    cs.emplace_back (43);
    // Before: [ 37, 41 ] -> [ 43, _ ]
    EXPECT_EQ (cs.chunks_size (), 2U);
    // After: [ _, _ ]
    cs.resize (0U);
    EXPECT_EQ (cs.chunks_size (), 1U);
    EXPECT_EQ (cs.size (), 0U);
    EXPECT_EQ (std::distance (std::begin (cs), std::end (cs)), 0U);
    EXPECT_EQ (cs.capacity (), 2U);
    EXPECT_TRUE (cs.empty ());
}